

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int parse_http_headers(char **buf,mg_header *hdr)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  
  lVar3 = 0;
  iVar2 = 0;
  do {
    if (lVar3 == 0x40) {
      return iVar2;
    }
    pcVar7 = *buf;
    pcVar5 = pcVar7 + -1;
    lVar4 = 1;
    do {
      pcVar7 = pcVar7 + 1;
      cVar6 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      lVar4 = lVar4 + -1;
      if (cVar6 == ':') break;
    } while (0xa1 < (byte)(cVar6 + 0x81U));
    if (lVar4 == 0) {
      return iVar2;
    }
    while (cVar6 == ' ') {
      *pcVar5 = '\0';
      pcVar1 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
      pcVar7 = pcVar7 + 1;
      cVar6 = *pcVar1;
    }
    if (cVar6 != ':') {
      return -1;
    }
    *pcVar5 = '\0';
    hdr[lVar3].name = *buf;
    for (; (*pcVar7 == ' ' || (*pcVar7 == '\t')); pcVar7 = pcVar7 + 1) {
    }
    hdr[lVar3].value = pcVar7;
    while( true ) {
      cVar6 = *pcVar7;
      if ((cVar6 == '\0') || (cVar6 == '\n')) break;
      if (cVar6 == '\r') {
        *pcVar7 = '\0';
        if (pcVar7[1] != '\n') {
          return -1;
        }
        pcVar7 = pcVar7 + 1;
        goto LAB_0010c6d1;
      }
      pcVar7 = pcVar7 + 1;
    }
    if (cVar6 == '\0') {
      *buf = pcVar7;
      return (int)lVar3 + 1;
    }
LAB_0010c6d1:
    iVar2 = (int)lVar3 + 1;
    *pcVar7 = '\0';
    *buf = pcVar7 + 1;
    if (pcVar7[1] == '\n') {
      return iVar2;
    }
    if (pcVar7[1] == '\r') {
      return iVar2;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int
parse_http_headers(char **buf, struct mg_header hdr[MG_MAX_HEADERS])
{
	int i;
	int num_headers = 0;

	for (i = 0; i < (int)MG_MAX_HEADERS; i++) {
		char *dp = *buf;

		/* Skip all ASCII characters (>SPACE, <127), to find a ':' */
		while ((*dp != ':') && (*dp >= 33) && (*dp <= 126)) {
			dp++;
		}
		if (dp == *buf) {
			/* End of headers reached. */
			break;
		}

		/* Drop all spaces after header name before : */
		while (*dp == ' ') {
			*dp = 0;
			dp++;
		}
		if (*dp != ':') {
			/* This is not a valid field. */
			return -1;
		}

		/* End of header key (*dp == ':') */
		/* Truncate here and set the key name */
		*dp = 0;
		hdr[i].name = *buf;

		/* Skip all spaces */
		do {
			dp++;
		} while ((*dp == ' ') || (*dp == '\t'));

		/* The rest of the line is the value */
		hdr[i].value = dp;

		/* Find end of line */
		while ((*dp != 0) && (*dp != '\r') && (*dp != '\n')) {
			dp++;
		};

		/* eliminate \r */
		if (*dp == '\r') {
			*dp = 0;
			dp++;
			if (*dp != '\n') {
				/* This is not a valid line. */
				return -1;
			}
		}

		/* here *dp is either 0 or '\n' */
		/* in any case, we have a new header */
		num_headers = i + 1;

		if (*dp) {
			*dp = 0;
			dp++;
			*buf = dp;

			if ((dp[0] == '\r') || (dp[0] == '\n')) {
				/* This is the end of the header */
				break;
			}
		} else {
			*buf = dp;
			break;
		}
	}
	return num_headers;
}